

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseExternalSubset(xmlParserCtxtPtr ctxt,xmlChar *ExternalID,xmlChar *SystemID)

{
  int iVar1;
  xmlParserInputPtr pxVar2;
  xmlDocPtr doc;
  xmlDtdPtr pxVar3;
  xmlChar *pxVar4;
  xmlChar xVar5;
  
  xmlCtxtInitializeLate(ctxt);
  xmlDetectEncoding(ctxt);
  pxVar4 = ctxt->input->cur;
  if ((((*pxVar4 == '<') && (pxVar4[1] == '?')) && (pxVar4[2] == 'x')) &&
     ((pxVar4[3] == 'm' && (pxVar4[4] == 'l')))) {
    xmlParseTextDecl(ctxt);
  }
  doc = ctxt->myDoc;
  if (doc == (xmlDocPtr)0x0) {
    doc = xmlNewDoc("1.0");
    ctxt->myDoc = doc;
    if (doc == (xmlDocPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      return;
    }
    doc->properties = 0x40;
  }
  if (doc->intSubset == (_xmlDtd *)0x0) {
    pxVar3 = xmlCreateIntSubset(doc,(xmlChar *)0x0,ExternalID,SystemID);
    if (pxVar3 == (xmlDtdPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
    }
  }
  ctxt->inSubset = 2;
  iVar1 = ctxt->inputNr;
  xmlSkipBlankCharsPE(ctxt);
  while( true ) {
    pxVar2 = ctxt->input;
    pxVar4 = pxVar2->cur;
    xVar5 = *pxVar4;
    if (((xVar5 == '\0') && (ctxt->inputNr <= iVar1)) || (1 < ctxt->disableSAX)) {
      while (iVar1 < ctxt->inputNr) {
        xmlPopPE(ctxt);
      }
      if (*ctxt->input->cur != '\0') {
        xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
        return;
      }
      return;
    }
    if (((pxVar2->flags & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar4 < 0xfa)) {
      xmlParserGrow(ctxt);
      pxVar4 = ctxt->input->cur;
      xVar5 = *pxVar4;
    }
    if (xVar5 != '<') break;
    if (pxVar4[1] == '?') {
LAB_001397cc:
      xmlParseMarkupDecl(ctxt);
    }
    else {
      if (pxVar4[1] != '!') break;
      if (pxVar4[2] != '[') goto LAB_001397cc;
      xmlParseConditionalSections(ctxt);
    }
    xmlSkipBlankCharsPE(ctxt);
    if ((ctxt->input->flags & 0x40) == 0) {
      xmlParserShrink(ctxt);
    }
  }
  xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
  xmlHaltParser(ctxt);
  return;
}

Assistant:

void
xmlParseExternalSubset(xmlParserCtxtPtr ctxt, const xmlChar *ExternalID,
                       const xmlChar *SystemID) {
    int oldInputNr;

    xmlCtxtInitializeLate(ctxt);

    xmlDetectEncoding(ctxt);

    if (CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) {
	xmlParseTextDecl(ctxt);
    }
    if (ctxt->myDoc == NULL) {
        ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
	if (ctxt->myDoc == NULL) {
	    xmlErrMemory(ctxt);
	    return;
	}
	ctxt->myDoc->properties = XML_DOC_INTERNAL;
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->intSubset == NULL) &&
        (xmlCreateIntSubset(ctxt->myDoc, NULL, ExternalID, SystemID) == NULL)) {
        xmlErrMemory(ctxt);
    }

    ctxt->inSubset = 2;
    oldInputNr = ctxt->inputNr;

    SKIP_BLANKS_PE;
    while (((RAW != 0) || (ctxt->inputNr > oldInputNr)) &&
           (!PARSER_STOPPED(ctxt))) {
	GROW;
        if ((RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
            xmlParseConditionalSections(ctxt);
        } else if ((RAW == '<') && ((NXT(1) == '!') || (NXT(1) == '?'))) {
            xmlParseMarkupDecl(ctxt);
        } else {
            xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
            xmlHaltParser(ctxt);
            return;
        }
        SKIP_BLANKS_PE;
        SHRINK;
    }

    while (ctxt->inputNr > oldInputNr)
        xmlPopPE(ctxt);

    if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
    }
}